

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2b53f::ReEscapeStrings::visit(ReEscapeStrings *this,LiteralString *lit)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  UString local_40;
  
  if (lit->tokenKind != RAW_DESUGARED) {
    return;
  }
  sVar2 = (lit->value)._M_string_length;
  uVar5 = 0;
  if (sVar2 != 0) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      iVar1 = *(int *)((long)(lit->value)._M_dataplus._M_p + lVar3);
      uVar5 = uVar5 + (iVar1 == 0x27);
      iVar4 = iVar4 + (uint)(iVar1 == 0x22);
      lVar3 = lVar3 + 4;
    } while (sVar2 << 2 != lVar3);
    uVar5 = (uint)(uVar5 == 0 && iVar4 != 0);
  }
  jsonnet::internal::jsonnet_string_escape(&local_40,&lit->value,SUB41(uVar5,0));
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  operator=(&lit->value,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  lit->tokenKind = (uint)(byte)(SUB41(uVar5,0) ^ 1);
  return;
}

Assistant:

void visit(LiteralString *lit)
    {
        if (lit->tokenKind != LiteralString::RAW_DESUGARED)
            return;

        // TODO: Share code with formatter.cpp EnforceStringStyle.
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : lit->value) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        bool use_single = (num_double > 0) && (num_single == 0);

        lit->value = jsonnet_string_escape(lit->value, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }